

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeglplatformcontext.cpp
# Opt level: O2

void __thiscall QEGLPlatformContext::updateFormatFromGL(QEGLPlatformContext *this)

{
  QSurfaceFormat *this_00;
  bool bVar1;
  int iVar2;
  RenderableType RVar3;
  uint uVar4;
  EGLDisplay pvVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  long lVar9;
  EGLConfig pvVar10;
  char *pcVar11;
  pair<int,_int> pVar12;
  OpenGLContextProfile profile;
  long in_FS_OFFSET;
  long local_78;
  QArrayDataPointer<char> local_68;
  char *local_50;
  int major;
  int iStack_40;
  int minor;
  long local_38;
  undefined4 extraout_var;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pvVar5 = (EGLDisplay)eglGetCurrentDisplay();
  if (pvVar5 == (EGLDisplay)0x0) {
    pvVar5 = this->m_eglDisplay;
  }
  uVar6 = eglGetCurrentContext();
  uVar7 = eglGetCurrentSurface(0x3059);
  uVar8 = eglGetCurrentSurface(0x305a);
  if (((this->m_flags).super_QFlagsStorageHelper<QEGLPlatformContext::Flag,_4>.
       super_QFlagsStorage<QEGLPlatformContext::Flag>.i & 1) == 0) {
    bVar1 = q_hasEglExtension(this->m_eglDisplay,"EGL_KHR_surfaceless_context");
    if (!bVar1) goto LAB_00567c21;
    lVar9 = 0;
  }
  else {
LAB_00567c21:
    iVar2 = (*(this->super_QPlatformOpenGLContext)._vptr_QPlatformOpenGLContext[0x12])(this);
    lVar9 = CONCAT44(extraout_var,iVar2);
  }
  iVar2 = eglMakeCurrent(this->m_eglDisplay,lVar9,lVar9,this->m_eglContext);
  if (iVar2 == 0) {
    pvVar10 = q_configFromGLFormat(this->m_eglDisplay,&this->m_format,false,1);
    local_78 = eglCreateContext(this->m_eglDisplay,pvVar10,0,(this->m_contextAttrs).d.ptr);
    if (local_78 != 0) {
      iVar2 = eglMakeCurrent(this->m_eglDisplay,lVar9,lVar9,local_78);
      if (iVar2 != 0) goto LAB_00567ca3;
    }
    local_68.d._0_4_ = 2;
    local_68.size._4_4_ = 0;
    local_68.d._4_4_ = 0;
    local_68.ptr._0_4_ = 0;
    local_68.ptr._4_4_ = 0;
    local_68.size._0_4_ = 0;
    local_50 = "default";
    uVar4 = eglGetError();
    QMessageLogger::warning
              ((char *)&local_68,
               "QEGLPlatformContext: Failed to make temporary surface current, format not updated (%x)"
               ,(ulong)uVar4);
    goto LAB_00567e70;
  }
  local_78 = 0;
LAB_00567ca3:
  this_00 = &this->m_format;
  RVar3 = QSurfaceFormat::renderableType(this_00);
  if (RVar3 == OpenGL) {
LAB_00567cc5:
    pcVar11 = (char *)glGetString(0x1f02);
    if (pcVar11 != (char *)0x0) {
      local_68.size._0_4_ = 0xaaaaaaaa;
      local_68.size._4_4_ = 0xaaaaaaaa;
      local_68.d._0_4_ = -0x55555556;
      local_68.d._4_4_ = -0x55555556;
      local_68.ptr._0_4_ = 0xaaaaaaaa;
      local_68.ptr._4_4_ = 0xaaaaaaaa;
      QByteArray::QByteArray((QByteArray *)&local_68,pcVar11,-1);
      major = -0x55555556;
      minor = -0x55555556;
      bVar1 = QPlatformOpenGLContext::parseOpenGLVersion((QByteArray *)&local_68,&major,&minor);
      if (bVar1) {
        QSurfaceFormat::setMajorVersion(this_00,major);
        QSurfaceFormat::setMinorVersion(this_00,minor);
      }
      QArrayDataPointer<char>::~QArrayDataPointer(&local_68);
    }
    QSurfaceFormat::setProfile(this_00,NoProfile);
    QSurfaceFormat::setOptions(this_00,(FormatOptions)0x0);
    RVar3 = QSurfaceFormat::renderableType(this_00);
    if (RVar3 == OpenGL) {
      iVar2 = QSurfaceFormat::majorVersion(this_00);
      if (iVar2 < 3) {
        QSurfaceFormat::setOption(this_00,DeprecatedFunctions,true);
      }
      else {
        minor = 0;
        glGetIntegerv(0x821e,&minor);
        if ((minor & 1U) == 0) {
          QSurfaceFormat::setOption(this_00,DeprecatedFunctions,true);
        }
        if ((minor & 2U) != 0) {
          QSurfaceFormat::setOption(this_00,DebugContext,true);
        }
        pVar12 = QSurfaceFormat::version(this_00);
        local_68.d._0_4_ = pVar12.first;
        local_68.d._4_4_ = pVar12.second;
        major = 3;
        iStack_40 = 2;
        bVar1 = std::operator>=((pair<int,_int> *)&local_68,(pair<int,_int> *)&major);
        if (bVar1) {
          minor = 0;
          glGetIntegerv(0x9126,&minor);
          if ((minor & 1U) == 0) {
            if ((minor & 2U) == 0) goto LAB_00567e51;
            profile = CompatibilityProfile;
          }
          else {
            profile = CoreProfile;
          }
          QSurfaceFormat::setProfile(this_00,profile);
        }
      }
    }
  }
  else {
    RVar3 = QSurfaceFormat::renderableType(this_00);
    if (RVar3 == OpenGLES) goto LAB_00567cc5;
  }
LAB_00567e51:
  (*(this->super_QPlatformOpenGLContext)._vptr_QPlatformOpenGLContext[0x14])(this);
  eglMakeCurrent(pvVar5,uVar7,uVar8,uVar6);
LAB_00567e70:
  if (lVar9 != 0) {
    (*(this->super_QPlatformOpenGLContext)._vptr_QPlatformOpenGLContext[0x13])(this,lVar9);
  }
  if (local_78 != 0) {
    eglDestroyContext(this->m_eglDisplay);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QEGLPlatformContext::updateFormatFromGL()
{
#ifndef QT_NO_OPENGL
    // Have to save & restore to prevent QOpenGLContext::currentContext() from becoming
    // inconsistent after QOpenGLContext::create().
    EGLDisplay prevDisplay = eglGetCurrentDisplay();
    if (prevDisplay == EGL_NO_DISPLAY) // when no context is current
        prevDisplay = m_eglDisplay;
    EGLContext prevContext = eglGetCurrentContext();
    EGLSurface prevSurfaceDraw = eglGetCurrentSurface(EGL_DRAW);
    EGLSurface prevSurfaceRead = eglGetCurrentSurface(EGL_READ);

    // Rely on the surfaceless extension, if available. This is beneficial since we can
    // avoid creating an extra pbuffer surface which is apparently troublesome with some
    // drivers (Mesa) when certain attributes are present (multisampling).
    EGLSurface tempSurface = EGL_NO_SURFACE;
    EGLContext tempContext = EGL_NO_CONTEXT;
    if (m_flags.testFlag(NoSurfaceless) || !q_hasEglExtension(m_eglDisplay, "EGL_KHR_surfaceless_context"))
        tempSurface = createTemporaryOffscreenSurface();

    EGLBoolean ok = eglMakeCurrent(m_eglDisplay, tempSurface, tempSurface, m_eglContext);
    if (!ok) {
        EGLConfig config = q_configFromGLFormat(m_eglDisplay, m_format, false, EGL_PBUFFER_BIT);
        tempContext = eglCreateContext(m_eglDisplay, config, nullptr, m_contextAttrs.constData());
        if (tempContext != EGL_NO_CONTEXT)
            ok = eglMakeCurrent(m_eglDisplay, tempSurface, tempSurface, tempContext);
    }
    if (ok) {
        if (m_format.renderableType() == QSurfaceFormat::OpenGL
            || m_format.renderableType() == QSurfaceFormat::OpenGLES) {
            const GLubyte *s = glGetString(GL_VERSION);
            if (s) {
                QByteArray version = QByteArray(reinterpret_cast<const char *>(s));
                int major, minor;
                if (QPlatformOpenGLContext::parseOpenGLVersion(version, major, minor)) {
                    m_format.setMajorVersion(major);
                    m_format.setMinorVersion(minor);
                }
            }
            m_format.setProfile(QSurfaceFormat::NoProfile);
            m_format.setOptions(QSurfaceFormat::FormatOptions());
            if (m_format.renderableType() == QSurfaceFormat::OpenGL) {
                // Check profile and options.
                if (m_format.majorVersion() < 3) {
                    m_format.setOption(QSurfaceFormat::DeprecatedFunctions);
                } else {
                    GLint value = 0;
                    glGetIntegerv(GL_CONTEXT_FLAGS, &value);
                    if (!(value & GL_CONTEXT_FLAG_FORWARD_COMPATIBLE_BIT))
                        m_format.setOption(QSurfaceFormat::DeprecatedFunctions);
                    if (value & GL_CONTEXT_FLAG_DEBUG_BIT)
                        m_format.setOption(QSurfaceFormat::DebugContext);
                    if (m_format.version() >= std::pair(3, 2)) {
                        value = 0;
                        glGetIntegerv(GL_CONTEXT_PROFILE_MASK, &value);
                        if (value & GL_CONTEXT_CORE_PROFILE_BIT)
                            m_format.setProfile(QSurfaceFormat::CoreProfile);
                        else if (value & GL_CONTEXT_COMPATIBILITY_PROFILE_BIT)
                            m_format.setProfile(QSurfaceFormat::CompatibilityProfile);
                    }
                }
            }
        }
        runGLChecks();
        eglMakeCurrent(prevDisplay, prevSurfaceDraw, prevSurfaceRead, prevContext);
    } else {
        qWarning("QEGLPlatformContext: Failed to make temporary surface current, format not updated (%x)", eglGetError());
    }
    if (tempSurface != EGL_NO_SURFACE)
        destroyTemporaryOffscreenSurface(tempSurface);
    if (tempContext != EGL_NO_CONTEXT)
        eglDestroyContext(m_eglDisplay, tempContext);
#endif // QT_NO_OPENGL
}